

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O2

String __thiscall Bstrlib::String::extractToken(String *this,char c,int *pos)

{
  int pos_00;
  int iVar1;
  int iVar2;
  int *in_RCX;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *puVar3;
  undefined7 in_register_00000031;
  String *this_00;
  String SVar4;
  String local_40;
  
  this_00 = (String *)CONCAT71(in_register_00000031,c);
  String(this);
  pos_00 = *in_RCX;
  iVar1 = (this_00->super_tagbstring).slen;
  puVar3 = extraout_RDX;
  if (pos_00 < iVar1) {
    iVar2 = Find(this_00,(char)pos,pos_00);
    if (iVar2 != -1) {
      iVar1 = iVar2;
    }
    midString(&local_40,(int)this_00,pos_00);
    operator=(this,&local_40);
    ~String(&local_40);
    *in_RCX = iVar1 + 1;
    puVar3 = extraout_RDX_00;
  }
  SVar4.super_tagbstring.data = puVar3;
  SVar4.super_tagbstring._0_8_ = this;
  return (String)SVar4.super_tagbstring;
}

Assistant:

String String::extractToken(char c, int & pos) const
    {
        String ret;
        if (pos >= slen) return ret;

        int findNextPos = Find(c, pos);
        if (findNextPos == -1) findNextPos = slen;
        ret = midString(pos, findNextPos - pos);
        pos = findNextPos + 1;
        return ret;
    }